

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# action.h
# Opt level: O3

void __thiscall re2c::Action::set_initial(Action *this,label_t label,bool used_marker)

{
  Initial *pIVar1;
  
  if (this->type == INITIAL) {
    operator_delete((this->info).initial,8);
  }
  this->type = INITIAL;
  pIVar1 = (Initial *)operator_new(8);
  (pIVar1->label).value = label.value;
  pIVar1->setMarker = used_marker;
  (this->info).initial = pIVar1;
  return;
}

Assistant:

void set_initial (label_t label, bool used_marker)
	{
		clear ();
		type = INITIAL;
		info.initial = new Initial (label, used_marker);
	}